

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O3

void __thiscall
OpenMD::DLM::rotateStep(DLM *this,int axes1,int axes2,RealType angle,Vector3d *ji,RotMat3x3d *A)

{
  undefined8 *puVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double (*padVar7) [3];
  long lVar8;
  double (*padVar9) [3];
  uint k;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  bool bVar14;
  undefined8 uVar15;
  SquareMatrix<double,_3> m;
  RotMat3x3d rot;
  double local_b8 [10];
  double local_68 [9];
  long lVar13;
  
  pdVar3 = local_b8 + 1;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar8 = 0;
    auVar12 = _DAT_002941f0;
    do {
      bVar14 = SUB164(auVar12 ^ _DAT_00294200,4) == -0x80000000 &&
               SUB164(auVar12 ^ _DAT_00294200,0) < -0x7ffffffd;
      if (bVar14) {
        uVar15 = 0x3ff0000000000000;
        if (lVar4 != lVar8) {
          uVar15 = 0;
        }
        *(undefined8 *)((long)pdVar3 + lVar8 + -8) = uVar15;
      }
      if (bVar14) {
        uVar15 = 0x3ff0000000000000;
        if (lVar4 + -8 != lVar8) {
          uVar15 = 0;
        }
        *(undefined8 *)((long)pdVar3 + lVar8) = uVar15;
      }
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x20);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 8;
    pdVar3 = pdVar3 + 3;
  } while (lVar5 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_68 + lVar4 + 0x10) = *(undefined8 *)((long)local_b8 + lVar4 + 0x10U)
    ;
    uVar15 = *(undefined8 *)((long)local_b8 + lVar4 + 8U);
    *(undefined8 *)((long)local_68 + lVar4) = *(undefined8 *)((long)local_b8 + lVar4);
    *(undefined8 *)((long)local_68 + lVar4 + 8) = uVar15;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  dVar10 = cos(angle);
  dVar11 = sin(angle);
  uVar2 = (ulong)(uint)axes1;
  local_68[uVar2 * 4] = dVar10;
  uVar6 = (ulong)(uint)axes2;
  local_68[uVar6 * 4] = dVar10;
  local_68[uVar2 * 3 + uVar6] = dVar11;
  local_68[uVar6 * 3 + uVar2] = -dVar11;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  pdVar3 = local_68;
  lVar4 = 0;
  do {
    dVar10 = local_b8[lVar4];
    lVar5 = 0;
    do {
      dVar10 = dVar10 + pdVar3[lVar5] * (ji->super_Vector<double,_3U>).data_[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    local_b8[lVar4] = dVar10;
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar4 != 3);
  (ji->super_Vector<double,_3U>).data_[2] = local_b8[2];
  (ji->super_Vector<double,_3U>).data_[0] = local_b8[0];
  (ji->super_Vector<double,_3U>).data_[1] = local_b8[1];
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[8] = 0.0;
  pdVar3 = local_68;
  lVar4 = 0;
  do {
    lVar5 = 0;
    padVar7 = (double (*) [3])A;
    do {
      dVar10 = local_b8[lVar4 * 3 + lVar5];
      lVar8 = 0;
      padVar9 = padVar7;
      do {
        dVar10 = dVar10 + pdVar3[lVar8] *
                          (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).
                          data_[0][0];
        lVar8 = lVar8 + 1;
        padVar9 = padVar9 + 1;
      } while (lVar8 != 3);
      local_b8[lVar4 * 3 + lVar5] = dVar10;
      lVar5 = lVar5 + 1;
      padVar7 = (double (*) [3])(*padVar7 + 1);
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)
     ((long)(A->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar4 + 0x10) = *(undefined8 *)((long)local_b8 + lVar4 + 0x10U);
    uVar15 = *(undefined8 *)((long)local_b8 + lVar4 + 8U);
    puVar1 = (undefined8 *)
             ((long)(A->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
             lVar4);
    *puVar1 = *(undefined8 *)((long)local_b8 + lVar4);
    puVar1[1] = uVar15;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  return;
}

Assistant:

void DLM::rotateStep(int axes1, int axes2, RealType angle, Vector3d& ji,
                       RotMat3x3d& A) {
    RealType sinAngle;
    RealType cosAngle;
    // RealType angleSqr;
    // RealType angleSqrOver4;
    // RealType top, bottom;

    RotMat3x3d tempA(A);  // initialize the tempA
    Vector3d tempJ(0.0);

    RotMat3x3d rot = RotMat3x3d::identity();  // initalize rot as a unit matrix

    // use a small angle aproximation for sin and cosine

    // angleSqr = angle * angle;
    // angleSqrOver4 = angleSqr / 4.0;
    // top = 1.0 - angleSqrOver4;
    // bottom = 1.0 + angleSqrOver4;

    // cosAngle = top / bottom;
    // sinAngle = angle / bottom;

    // or don't use the small angle approximation:
    cosAngle          = cos(angle);
    sinAngle          = sin(angle);
    rot(axes1, axes1) = cosAngle;
    rot(axes2, axes2) = cosAngle;

    rot(axes1, axes2) = sinAngle;
    rot(axes2, axes1) = -sinAngle;

    // rotate the momentum acoording to: ji[] = rot[][] * ji[]
    ji = rot * ji;

    // This code comes from converting an algorithm detailed in
    // J. Chem. Phys. 107 (15), pp. 5840-5851 by Dullweber,
    // Leimkuhler and McLachlan (DLM) for use in our code.
    // In Appendix A, the DLM paper has the change to the rotation
    // matrix as: Q = Q * rot.transpose(), but our rotation matrix
    // A is actually equivalent to Q.transpose(). This fact can be
    // seen on page 5849 of the DLM paper where a lab frame
    // dipole \mu_i(t) is expressed in terms of a body-fixed
    // reference orientation, \bar{\mu_i} and the rotation matrix, Q:
    //  \mu_i(t) = Q * \bar{\mu_i}
    // Our code computes lab frame vectors from body-fixed reference
    // vectors using:
    //   v_{lab} = A.transpose() * v_{body}
    //  (See StuntDouble.hpp for confirmation of this fact).
    //
    // So, using the identity:
    //  (A * B).transpose() = B.transpose() * A.transpose(),  we
    // get the equivalent of Q = Q * rot.transpose() for our code to be:

    A = rot * A;
  }